

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = Consume(this,"service");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_40,service_location,1);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_40,&service->super_Message,NAME);
    output = ServiceDescriptorProto::mutable_name_abi_cxx11_(service);
    bVar1 = ConsumeIdentifier(this,output,"Expected service name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location,
                                (FileDescriptorProto *)location.location_);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service,
    const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        service, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}